

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_ary.c
# Opt level: O3

void fiobj_ary_set(FIOBJ ary,FIOBJ obj,int64_t pos)

{
  long lVar1;
  FIOBJ o;
  long lVar2;
  
  if ((((ary != 0) && ((~(uint)ary & 6) != 0)) && ((ary & 1) == 0)) &&
     (*(char *)(ary & 0xfffffffffffffff8) == ')')) {
    lVar1 = *(long *)(ary + 8);
    lVar2 = *(long *)(ary + 0x10);
    if (lVar1 == lVar2) {
      ((fio_ary___s *)(ary + 8))->start = 0;
      *(undefined8 *)(ary + 0x10) = 0;
      lVar1 = 0;
      lVar2 = 0;
    }
    if (pos < 0) {
      pos = (pos - lVar1) + lVar2;
      if (pos < 1) {
        pos = 0;
      }
    }
    lVar2 = (lVar1 - lVar2) + pos;
    if (lVar2 < 0) {
      lVar1 = lVar1 * 8 + *(long *)(ary + 0x20);
      o = *(FIOBJ *)(lVar1 + pos * 8);
      *(FIOBJ *)(lVar1 + pos * 8) = obj;
    }
    else {
      fio_ary_____require_on_top((fio_ary___s *)(ary + 8),lVar2 + 1);
      if (lVar2 != 0) {
        memset((void *)(*(long *)(ary + 0x10) * 8 + *(long *)(ary + 0x20)),0,lVar2 * 8);
      }
      *(FIOBJ *)(*(long *)(ary + 8) * 8 + *(long *)(ary + 0x20) + pos * 8) = obj;
      *(int64_t *)(ary + 0x10) = pos + 1;
      o = 0;
    }
    fiobj_free(o);
    return;
  }
  __assert_fail("ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_ary.c"
                ,0x8c,"void fiobj_ary_set(FIOBJ, FIOBJ, int64_t)");
}

Assistant:

void fiobj_ary_set(FIOBJ ary, FIOBJ obj, int64_t pos) {
  assert(ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY));
  FIOBJ old = FIOBJ_INVALID;
  fio_ary___set(&obj2ary(ary)->ary, pos, obj, &old);
  fiobj_free(old);
}